

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

CTransactionRef
miniminer_tests::make_tx(vector<COutPoint,_std::allocator<COutPoint>_> *inputs,size_t num_outputs)

{
  long lVar1;
  size_type sVar2;
  const_reference __src;
  reference __dest;
  CScript *this;
  reference pvVar3;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  CTransactionRef CVar4;
  size_t i_1;
  size_t i;
  CMutableTransaction tx;
  CMutableTransaction *in_stack_ffffffffffffff18;
  CMutableTransaction *in_stack_ffffffffffffff20;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffff28;
  size_type in_stack_ffffffffffffff30;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff38;
  ulong uVar5;
  element_type *this_00;
  ulong local_98;
  ulong local_90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffff18);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::size
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff18);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  local_90 = 0;
  while( true ) {
    uVar5 = local_90;
    sVar2 = std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                      ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff18);
    if (sVar2 <= uVar5) break;
    __src = std::vector<COutPoint,_std::allocator<COutPoint>_>::operator[]
                      (in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    __dest = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff28,
                        (size_type)in_stack_ffffffffffffff20);
    memcpy(__dest,__src,0x24);
    local_90 = local_90 + 1;
  }
  for (local_98 = 0; local_98 < in_RDX; local_98 = local_98 + 1) {
    CScript::CScript((CScript *)in_stack_ffffffffffffff18);
    CScript::operator<<((CScript *)this_00,(opcodetype)(uVar5 >> 0x20));
    this = CScript::operator<<((CScript *)this_00,(opcodetype)(uVar5 >> 0x20));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this,(size_type)in_stack_ffffffffffffff20)
    ;
    CScript::operator=(this,(CScript *)in_stack_ffffffffffffff20);
    CScript::~CScript((CScript *)in_stack_ffffffffffffff18);
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)this,
                        (size_type)in_stack_ffffffffffffff20);
    pvVar3->nValue = 100000000;
  }
  MakeTransactionRef<CMutableTransaction&>(in_stack_ffffffffffffff20);
  CMutableTransaction::~CMutableTransaction(in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, size_t num_outputs)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(num_outputs);
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout = inputs[i];
    }
    for (size_t i = 0; i < num_outputs; ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        // The actual input and output values of these transactions don't really
        // matter, since all accounting will use the entries' cached fees.
        tx.vout[i].nValue = COIN;
    }
    return MakeTransactionRef(tx);
}